

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O1

char * cmd_reg(skynet_context *context,char *param)

{
  char *pcVar1;
  
  if (param != (char *)0x0) {
    if (*param == '.') {
      pcVar1 = skynet_handle_namehandle(context->handle,param + 1);
      return pcVar1;
    }
    if (*param != '\0') {
      skynet_error(context,"Can\'t register global name %s in C");
      return (char *)0x0;
    }
  }
  sprintf(context->result,":%x",(ulong)context->handle);
  return context->result;
}

Assistant:

static const char *
cmd_reg(struct skynet_context * context, const char * param) {
	if (param == NULL || param[0] == '\0') {
		sprintf(context->result, ":%x", context->handle);
		return context->result;
	} else if (param[0] == '.') {
		return skynet_handle_namehandle(context->handle, param + 1);
	} else {
		skynet_error(context, "Can't register global name %s in C", param);
		return NULL;
	}
}